

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run-loader.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint __line;
  int iVar1;
  FILE *__stream;
  yaml_node_t *pyVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  yaml_document_t document;
  yaml_parser_t parser;
  
  if (argc < 2) {
    printf("Usage: %s file1.yaml ...\n",*argv);
  }
  else {
    for (uVar4 = 1; uVar4 != (uint)argc; uVar4 = uVar4 + 1) {
      printf("[%d] Loading \'%s\': ",uVar4 & 0xffffffff,argv[uVar4]);
      fflush(_stdout);
      __stream = fopen(argv[uVar4],"rb");
      if (__stream == (FILE *)0x0) {
        pcVar3 = "file";
        __line = 0x22;
LAB_001023ca:
        __assert_fail(pcVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/tests/run-loader.c"
                      ,__line,"int main(int, char **)");
      }
      iVar1 = yaml_parser_initialize(&parser);
      if (iVar1 == 0) {
        pcVar3 = "yaml_parser_initialize(&parser)";
        __line = 0x24;
        goto LAB_001023ca;
      }
      yaml_parser_set_input_file(&parser,(FILE *)__stream);
      uVar5 = 0;
      bVar6 = true;
      while (bVar6) {
        iVar1 = yaml_parser_load(&parser,&document);
        if (iVar1 == 0) break;
        pyVar2 = yaml_document_get_root_node(&document);
        bVar6 = pyVar2 != (yaml_node_t *)0x0;
        yaml_document_delete(&document);
        uVar5 = (ulong)((int)uVar5 + (uint)bVar6);
      }
      yaml_parser_delete(&parser);
      iVar1 = fclose(__stream);
      if (iVar1 != 0) {
        pcVar3 = "!fclose(file)";
        __line = 0x38;
        goto LAB_001023ca;
      }
      pcVar3 = "SUCCESS";
      if (bVar6) {
        pcVar3 = "FAILURE";
      }
      printf("%s (%d documents)\n",pcVar3,uVar5);
    }
  }
  return 0;
}

Assistant:

int
main(int argc, char *argv[])
{
    int number;

    if (argc < 2) {
        printf("Usage: %s file1.yaml ...\n", argv[0]);
        return 0;
    }

    for (number = 1; number < argc; number ++)
    {
        FILE *file;
        yaml_parser_t parser;
        yaml_document_t document;
        int done = 0;
        int count = 0;
        int error = 0;

        printf("[%d] Loading '%s': ", number, argv[number]);
        fflush(stdout);

        file = fopen(argv[number], "rb");
        assert(file);

        assert(yaml_parser_initialize(&parser));

        yaml_parser_set_input_file(&parser, file);

        while (!done)
        {
            if (!yaml_parser_load(&parser, &document)) {
                error = 1;
                break;
            }

            done = (!yaml_document_get_root_node(&document));

            yaml_document_delete(&document);

            if (!done) count ++;
        }

        yaml_parser_delete(&parser);

        assert(!fclose(file));

        printf("%s (%d documents)\n", (error ? "FAILURE" : "SUCCESS"), count);
    }

    return 0;
}